

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

MemoryRegion *
flatview_translate_mipsel
          (uc_struct_conflict5 *uc,FlatView *fv,hwaddr addr,hwaddr *xlat,hwaddr *plen,_Bool is_write
          ,MemTxAttrs attrs)

{
  IOMMUMemoryRegion *iommu_mr;
  MemoryRegionSection *pMVar1;
  AddressSpace **in_stack_ffffffffffffff90;
  MemTxAttrs in_stack_ffffffffffffff98;
  hwaddr local_60;
  MemoryRegionSection local_58;
  
  local_60 = 0xffffffffffffffff;
  if (plen == (hwaddr *)0x0) {
    plen = &local_60;
  }
  pMVar1 = address_space_translate_internal(fv->dispatch,addr,xlat,plen,true);
  iommu_mr = (IOMMUMemoryRegion *)pMVar1->mr;
  if ((iommu_mr == (IOMMUMemoryRegion *)0x0) || ((iommu_mr->parent_obj).is_iommu == false)) {
    local_58.mr = pMVar1->mr;
  }
  else {
    address_space_translate_iommu
              (&local_58,iommu_mr,xlat,plen,(hwaddr *)(ulong)is_write,
               SUB81(&stack0xffffffffffffff98,0),attrs._0_1_,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff98);
  }
  return local_58.mr;
}

Assistant:

MemoryRegion *flatview_translate(struct uc_struct *uc, FlatView *fv, hwaddr addr, hwaddr *xlat,
                                 hwaddr *plen, bool is_write,
                                 MemTxAttrs attrs)
{
    MemoryRegion *mr;
    MemoryRegionSection section;
    AddressSpace *as = NULL;

    /* This can be MMIO, so setup MMIO bit. */
    section = flatview_do_translate(uc, fv, addr, xlat, plen, NULL,
                                    is_write, true, &as, attrs);
    mr = section.mr;

    return mr;
}